

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TextFlow::Columns::iterator::iterator
          (iterator *this,
          vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *columns)

{
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *this_00;
  bool bVar1;
  size_type __n;
  const_iterator local_78;
  reference local_50;
  Column *col;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *__range2;
  Columns *columns_local;
  iterator *this_local;
  
  this->m_columns = columns;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::vector(&this->m_iterators);
  this->m_activeIterators = 0;
  __n = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                  (this->m_columns);
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(&this->m_iterators,__n);
  this_00 = this->m_columns;
  __end2 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::begin
                     (this_00);
  col = (Column *)
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::end(this_00)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                                *)&col);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
               ::operator*(&__end2);
    Column::end(&local_78,local_50);
    std::
    vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
    ::push_back(&this->m_iterators,&local_78);
    __gnu_cxx::
    __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns, EndTag ):
            m_columns( columns.m_columns ), m_activeIterators( 0 ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.end() );
            }
        }